

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autocompact_test.cc
# Opt level: O1

void __thiscall leveldb::AutoCompactTest::DoReads(AutoCompactTest *this,int n)

{
  DB *pDVar1;
  ulong uVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  FILE *__stream;
  size_type sVar4;
  undefined7 uVar5;
  undefined8 uVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  char cVar8;
  uint uVar9;
  long *plVar10;
  long lVar11;
  Env *pEVar12;
  AutoCompactTest *pAVar13;
  string *this_00;
  _func_int **pp_Var14;
  string *message;
  int iVar15;
  undefined1 auVar16 [16];
  AssertionResult gtest_ar_1;
  uint64_t size_2;
  string limit_key;
  int64_t final_other_size;
  string value;
  string local_148;
  uint local_11c;
  AutoCompactTest *local_118;
  undefined1 local_110 [24];
  undefined1 local_f8 [40];
  AutoCompactTest *pAStack_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  string local_b8;
  string local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_78;
  AutoCompactTest *pAStack_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  AutoCompactTest *pAStack_40;
  undefined4 extraout_var;
  
  local_78 = &local_68;
  std::__cxx11::string::_M_construct((ulong)&local_78,'\0');
  local_110._8_8_ = this->db_;
  iVar15 = 0;
  local_118 = this;
  do {
    pDVar1 = local_118->db_;
    local_11c = local_11c & 0xffffff00;
    Key_abi_cxx11_(&local_148,local_118,iVar15);
    local_98._M_dataplus._M_p = local_148._M_dataplus._M_p;
    local_98._M_string_length = local_148._M_string_length;
    local_f8._32_8_ = local_78;
    pAStack_d0 = pAStack_70;
    (*pDVar1->_vptr_DB[2])(&local_b8,pDVar1,&local_11c,&local_98,local_f8 + 0x20);
    testing::internal::PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>::operator()
              ((PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher> *)local_f8,local_110,
               (Status *)"db_->Put(WriteOptions(), Key(i), value)");
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      operator_delete__(local_b8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_dataplus._M_p != &local_148.field_2) {
      operator_delete(local_148._M_dataplus._M_p);
    }
    uVar6 = local_f8._8_8_;
    if ((PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>)local_f8[0] ==
        (PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>)0x0) {
      testing::Message::Message((Message *)&local_148);
      if ((AutoCompactTest *)local_f8._8_8_ == (AutoCompactTest *)0x0) {
        pp_Var14 = (_func_int **)0x15a8aa;
      }
      else {
        pp_Var14 = ((Test *)local_f8._8_8_)->_vptr_Test;
      }
      iVar15 = 0x41;
      goto LAB_0010b47f;
    }
    if ((AutoCompactTest *)local_f8._8_8_ != (AutoCompactTest *)0x0) {
      pp_Var14 = ((Test *)local_f8._8_8_)->_vptr_Test;
      if ((string *)pp_Var14 != (string *)(local_f8._8_8_ + 0x10)) {
        operator_delete(pp_Var14);
      }
      operator_delete((void *)uVar6);
    }
    iVar15 = iVar15 + 1;
  } while (iVar15 != 0x200);
  DBImpl::TEST_CompactMemTable((DBImpl *)local_f8);
  testing::internal::PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>::operator()
            ((PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher> *)&local_148,
             (char *)&local_98,(Status *)"dbi->TEST_CompactMemTable()");
  if ((void *)CONCAT71(local_f8._1_7_,local_f8[0]) != (void *)0x0) {
    operator_delete__((void *)CONCAT71(local_f8._1_7_,local_f8[0]));
  }
  sVar4 = local_148._M_string_length;
  if ((char)local_148._M_dataplus._M_p != '\0') {
    if ((AutoCompactTest *)local_148._M_string_length != (AutoCompactTest *)0x0) {
      pp_Var14 = ((Test *)local_148._M_string_length)->_vptr_Test;
      if ((string *)pp_Var14 != (string *)(local_148._M_string_length + 0x10)) {
        operator_delete(pp_Var14);
      }
      operator_delete((void *)sVar4);
    }
    iVar15 = 0;
LAB_0010ade4:
    pDVar1 = local_118->db_;
    local_110[0] = '\0';
    Key_abi_cxx11_(&local_148,local_118,iVar15);
    local_98._M_dataplus._M_p = local_148._M_dataplus._M_p;
    local_98._M_string_length = local_148._M_string_length;
    (*pDVar1->_vptr_DB[3])(local_f8 + 0x20,pDVar1,local_110,&local_98);
    testing::internal::PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>::operator()
              ((PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher> *)local_f8,
               (char *)&local_b8,(Status *)"db_->Delete(WriteOptions(), Key(i))");
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._32_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      operator_delete__((void *)local_f8._32_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_dataplus._M_p != &local_148.field_2) {
      operator_delete(local_148._M_dataplus._M_p);
    }
    uVar6 = local_f8._8_8_;
    if ((PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>)local_f8[0] !=
        (PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>)0x0) goto code_r0x0010ae6a;
    testing::Message::Message((Message *)&local_148);
    if ((AutoCompactTest *)local_f8._8_8_ == (AutoCompactTest *)0x0) {
      pp_Var14 = (_func_int **)0x15a8aa;
    }
    else {
      pp_Var14 = ((Test *)local_f8._8_8_)->_vptr_Test;
    }
    iVar15 = 0x47;
LAB_0010b47f:
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_98,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/autocompact_test.cc"
               ,iVar15,(char *)pp_Var14);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_98,(Message *)&local_148);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_98);
    pAVar13 = (AutoCompactTest *)local_f8._8_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_148._M_dataplus._M_p + 8))();
      pAVar13 = (AutoCompactTest *)local_f8._8_8_;
    }
    goto LAB_0010b524;
  }
  testing::Message::Message((Message *)local_f8);
  if ((AutoCompactTest *)local_148._M_string_length == (AutoCompactTest *)0x0) {
    pp_Var14 = (_func_int **)0x15a8aa;
  }
  else {
    pp_Var14 = ((Test *)local_148._M_string_length)->_vptr_Test;
  }
  iVar15 = 0x43;
LAB_0010b4f4:
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&local_98,kFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/autocompact_test.cc"
             ,iVar15,(char *)pp_Var14);
  testing::internal::AssertHelper::operator=((AssertHelper *)&local_98,(Message *)local_f8);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_98);
  pAVar13 = (AutoCompactTest *)local_148._M_string_length;
  if ((long *)CONCAT71(local_f8._1_7_,local_f8[0]) != (long *)0x0) {
    (**(code **)(*(long *)CONCAT71(local_f8._1_7_,local_f8[0]) + 8))();
    pAVar13 = (AutoCompactTest *)local_148._M_string_length;
  }
LAB_0010b524:
  if (pAVar13 != (AutoCompactTest *)0x0) {
    pp_Var14 = (pAVar13->super_Test)._vptr_Test;
    if ((string *)pp_Var14 != &pAVar13->dbname_) {
      operator_delete(pp_Var14);
    }
    operator_delete(pAVar13);
  }
LAB_0010b54a:
  if (local_78 != &local_68) {
    operator_delete(local_78);
  }
  return;
code_r0x0010ae6a:
  if ((AutoCompactTest *)local_f8._8_8_ != (AutoCompactTest *)0x0) {
    pp_Var14 = ((Test *)local_f8._8_8_)->_vptr_Test;
    if ((string *)pp_Var14 != (string *)(local_f8._8_8_ + 0x10)) {
      operator_delete(pp_Var14);
    }
    operator_delete((void *)uVar6);
  }
  iVar15 = iVar15 + 1;
  if (iVar15 == 0x200) goto code_r0x0010ae9d;
  goto LAB_0010ade4;
code_r0x0010ae9d:
  DBImpl::TEST_CompactMemTable((DBImpl *)local_f8);
  testing::internal::PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>::operator()
            ((PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher> *)&local_148,
             (char *)&local_98,(Status *)"dbi->TEST_CompactMemTable()");
  if ((void *)CONCAT71(local_f8._1_7_,local_f8[0]) != (void *)0x0) {
    operator_delete__((void *)CONCAT71(local_f8._1_7_,local_f8[0]));
  }
  if ((char)local_148._M_dataplus._M_p != '\0') {
    if ((AutoCompactTest *)local_148._M_string_length != (AutoCompactTest *)0x0) {
      pp_Var14 = ((Test *)local_148._M_string_length)->_vptr_Test;
      if ((string *)pp_Var14 != (string *)(local_148._M_string_length + 0x10)) {
        operator_delete(pp_Var14);
      }
      operator_delete((void *)local_148._M_string_length);
    }
    pAVar13 = local_118;
    Key_abi_cxx11_((string *)local_f8,local_118,0);
    local_110._8_8_ = CONCAT71(local_f8._1_7_,local_f8[0]);
    local_110._16_8_ = local_f8._8_8_;
    Key_abi_cxx11_(&local_98,pAVar13,n);
    local_148._M_dataplus._M_p = (pointer)local_110._8_8_;
    local_148._M_string_length = local_110._16_8_;
    local_148.field_2._M_allocated_capacity = (size_type)local_98._M_dataplus._M_p;
    local_148.field_2._8_8_ = local_98._M_string_length;
    pDVar1 = pAVar13->db_;
    (*pDVar1->_vptr_DB[10])(pDVar1,&local_148,1,local_f8 + 0x20);
    uVar6 = local_f8._32_8_;
    paVar3 = &local_98.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != paVar3) {
      operator_delete(local_98._M_dataplus._M_p);
    }
    if ((undefined1 *)CONCAT71(local_f8._1_7_,local_f8[0]) != local_f8 + 0x10) {
      operator_delete((undefined1 *)CONCAT71(local_f8._1_7_,local_f8[0]));
    }
    pAVar13 = local_118;
    Key_abi_cxx11_((string *)local_f8,local_118,n);
    local_110._8_8_ = CONCAT71(local_f8._1_7_,local_f8[0]);
    local_110._16_8_ = local_f8._8_8_;
    Key_abi_cxx11_(&local_98,pAVar13,0x200);
    local_148._M_dataplus._M_p = (pointer)local_110._8_8_;
    local_148._M_string_length = local_110._16_8_;
    local_148.field_2._M_allocated_capacity = (size_type)local_98._M_dataplus._M_p;
    local_148.field_2._8_8_ = local_98._M_string_length;
    pDVar1 = pAVar13->db_;
    (*pDVar1->_vptr_DB[10])(pDVar1,&local_148,1,local_f8 + 0x20);
    local_58 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_f8._32_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != paVar3) {
      operator_delete(local_98._M_dataplus._M_p);
    }
    if ((undefined1 *)CONCAT71(local_f8._1_7_,local_f8[0]) != local_f8 + 0x10) {
      operator_delete((undefined1 *)CONCAT71(local_f8._1_7_,local_f8[0]));
    }
    Key_abi_cxx11_((string *)local_f8,local_118,n);
    local_11c = 0;
    local_f8._32_4_ = 100;
    testing::internal::CmpHelperLT<int,int>
              ((internal *)&local_148,"read","100",(int *)&local_11c,(int *)(local_f8 + 0x20));
    if ((char)local_148._M_dataplus._M_p == '\x01') {
      local_50._M_allocated_capacity = (long)uVar6 / 10;
      do {
        if ((AutoCompactTest *)local_148._M_string_length != (AutoCompactTest *)0x0) {
          DoReads((AutoCompactTest *)local_148._M_string_length);
        }
        local_148._M_dataplus._M_p = (pointer)0x100;
        local_148._M_string_length = 0;
        iVar15 = (*local_118->db_->_vptr_DB[6])(local_118->db_,&local_148);
        plVar10 = (long *)CONCAT44(extraout_var,iVar15);
        lVar11 = 0x18;
        do {
          (**(code **)(*plVar10 + lVar11))(plVar10);
          cVar8 = (**(code **)(*plVar10 + 0x10))(plVar10);
          uVar9 = 0;
          if (cVar8 != '\0') {
            auVar16 = (**(code **)(*plVar10 + 0x40))(plVar10);
            local_98._M_dataplus._M_p = (pointer)paVar3;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_98,auVar16._0_8_,auVar16._8_8_ + auVar16._0_8_);
            sVar4 = local_98._M_string_length;
            uVar6 = local_f8._8_8_;
            pAVar13 = (AutoCompactTest *)local_98._M_string_length;
            if ((ulong)local_f8._8_8_ < local_98._M_string_length) {
              pAVar13 = (AutoCompactTest *)local_f8._8_8_;
            }
            if (pAVar13 != (AutoCompactTest *)0x0) {
              uVar9 = memcmp(local_98._M_dataplus._M_p,(void *)CONCAT71(local_f8._1_7_,local_f8[0]),
                             (size_t)pAVar13);
            }
            if (uVar9 == 0) {
              lVar11 = sVar4 - uVar6;
              if (lVar11 < -0x7fffffff) {
                lVar11 = -0x80000000;
              }
              if (0x7ffffffe < lVar11) {
                lVar11 = 0;
              }
              uVar9 = (uint)lVar11;
            }
            uVar9 = uVar9 >> 0x1f;
          }
          if ((cVar8 != '\0') &&
             ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_dataplus._M_p != paVar3)) {
            operator_delete(local_98._M_dataplus._M_p);
          }
          lVar11 = 0x30;
        } while ((char)uVar9 != '\0');
        (**(code **)(*plVar10 + 8))(plVar10);
        pEVar12 = Env::Default();
        (*pEVar12->_vptr_Env[0x16])(pEVar12,1000000);
        pAVar13 = local_118;
        Key_abi_cxx11_((string *)(local_f8 + 0x20),local_118,0);
        local_110._8_8_ = local_f8._32_8_;
        local_110._16_8_ = pAStack_d0;
        Key_abi_cxx11_(&local_b8,pAVar13,n);
        local_148._M_dataplus._M_p = (pointer)local_110._8_8_;
        local_148._M_string_length = local_110._16_8_;
        local_148.field_2._M_allocated_capacity = (size_type)local_b8._M_dataplus._M_p;
        local_148.field_2._8_8_ = local_b8._M_string_length;
        pDVar1 = pAVar13->db_;
        (*pDVar1->_vptr_DB[10])(pDVar1,&local_148,1,local_110);
        uVar5 = local_110._1_7_;
        uVar2 = CONCAT71(local_110._1_7_,local_110[0]);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
          operator_delete(local_b8._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._32_8_ != &local_c8) {
          operator_delete((void *)local_f8._32_8_);
        }
        pAVar13 = local_118;
        __stream = _stderr;
        uVar9 = local_11c + 1;
        auVar16._8_4_ = SUB74(uVar5,3);
        auVar16._0_8_ = uVar2;
        auVar16._12_4_ = 0x45300000;
        local_110._16_8_ = auVar16._8_8_ - 1.9342813113834067e+25;
        local_110._8_8_ =
             ((double)local_110._16_8_ +
             ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0)) * 9.5367431640625e-07;
        Key_abi_cxx11_((string *)(local_f8 + 0x20),local_118,n);
        local_50._8_8_ = local_f8._32_8_;
        pAStack_40 = pAStack_d0;
        Key_abi_cxx11_(&local_b8,pAVar13,0x200);
        local_148._M_dataplus._M_p = (pointer)local_50._8_8_;
        local_148._M_string_length = (size_type)pAStack_40;
        local_148.field_2._M_allocated_capacity = (size_type)local_b8._M_dataplus._M_p;
        local_148.field_2._8_8_ = local_b8._M_string_length;
        pDVar1 = pAVar13->db_;
        (*pDVar1->_vptr_DB[10])(pDVar1,&local_148,1,local_110);
        fprintf(__stream,"iter %3d => %7.3f MB [other %7.3f MB]\n",(ulong)uVar9);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
          operator_delete(local_b8._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._32_8_ != &local_c8) {
          operator_delete((void *)local_f8._32_8_);
        }
        pAVar13 = local_118;
        if (uVar2 <= local_50._M_allocated_capacity) {
          Key_abi_cxx11_((string *)(local_f8 + 0x20),local_118,n);
          local_110._8_8_ = local_f8._32_8_;
          local_110._16_8_ = pAStack_d0;
          Key_abi_cxx11_(&local_b8,pAVar13,0x200);
          local_148._M_dataplus._M_p = (pointer)local_110._8_8_;
          local_148._M_string_length = local_110._16_8_;
          local_148.field_2._M_allocated_capacity = (size_type)local_b8._M_dataplus._M_p;
          local_148.field_2._8_8_ = local_b8._M_string_length;
          pDVar1 = pAVar13->db_;
          (*pDVar1->_vptr_DB[10])(pDVar1,&local_148,1,local_110);
          paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)CONCAT71(local_110._1_7_,local_110[0]);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
            operator_delete(local_b8._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._32_8_ != &local_c8) {
            operator_delete((void *)local_f8._32_8_);
          }
          paVar7 = local_58;
          local_b8._M_dataplus._M_p = (pointer)(&local_58->_M_allocated_capacity + 0x20000);
          local_f8._32_8_ = paVar3;
          testing::internal::CmpHelperLE<long,long>
                    ((internal *)&local_148,"final_other_size","initial_other_size + 1048576",
                     (long *)(local_f8 + 0x20),(long *)&local_b8);
          sVar4 = local_148._M_string_length;
          if ((char)local_148._M_dataplus._M_p == '\0') {
            testing::Message::Message((Message *)&local_b8);
            if ((AutoCompactTest *)local_148._M_string_length == (AutoCompactTest *)0x0) {
              pp_Var14 = (_func_int **)0x15a8aa;
            }
            else {
              pp_Var14 = ((Test *)local_148._M_string_length)->_vptr_Test;
            }
            iVar15 = 0x66;
          }
          else {
            if ((AutoCompactTest *)local_148._M_string_length != (AutoCompactTest *)0x0) {
              pp_Var14 = ((Test *)local_148._M_string_length)->_vptr_Test;
              if ((string *)pp_Var14 != (string *)(local_148._M_string_length + 0x10)) {
                operator_delete(pp_Var14);
              }
              operator_delete((void *)sVar4);
            }
            local_b8._M_dataplus._M_p = (pointer)((long)paVar7 / 5 + -0x100000);
            testing::internal::CmpHelperGE<long,long>
                      ((internal *)&local_148,"final_other_size","initial_other_size / 5 - 1048576",
                       (long *)(local_f8 + 0x20),(long *)&local_b8);
            if ((char)local_148._M_dataplus._M_p != '\0') goto LAB_0010b628;
            testing::Message::Message((Message *)&local_b8);
            if ((AutoCompactTest *)local_148._M_string_length == (AutoCompactTest *)0x0) {
              pp_Var14 = (_func_int **)0x15a8aa;
            }
            else {
              pp_Var14 = ((Test *)local_148._M_string_length)->_vptr_Test;
            }
            iVar15 = 0x67;
          }
          this_00 = (string *)local_110;
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)local_110,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/autocompact_test.cc"
                     ,iVar15,(char *)pp_Var14);
          message = &local_b8;
          goto LAB_0010b607;
        }
        local_11c = local_11c + 1;
        local_f8._32_4_ = 100;
        testing::internal::CmpHelperLT<int,int>
                  ((internal *)&local_148,"read","100",(int *)&local_11c,(int *)(local_f8 + 0x20));
      } while ((char)local_148._M_dataplus._M_p != '\0');
    }
    testing::Message::Message((Message *)(local_f8 + 0x20));
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_f8._32_8_ + 0x10),"Taking too long to compact",0x1a);
    if ((AutoCompactTest *)local_148._M_string_length == (AutoCompactTest *)0x0) {
      pp_Var14 = (_func_int **)0x15a8aa;
    }
    else {
      pp_Var14 = ((Test *)local_148._M_string_length)->_vptr_Test;
    }
    this_00 = &local_b8;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)this_00,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/autocompact_test.cc"
               ,0x52,(char *)pp_Var14);
    message = (string *)(local_f8 + 0x20);
LAB_0010b607:
    testing::internal::AssertHelper::operator=((AssertHelper *)this_00,(Message *)message);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_00);
    plVar10 = (long *)(message->_M_dataplus)._M_p;
    if (plVar10 != (long *)0x0) {
      (**(code **)(*plVar10 + 8))();
    }
LAB_0010b628:
    sVar4 = local_148._M_string_length;
    if ((AutoCompactTest *)local_148._M_string_length != (AutoCompactTest *)0x0) {
      pp_Var14 = ((Test *)local_148._M_string_length)->_vptr_Test;
      if ((string *)pp_Var14 != (string *)(local_148._M_string_length + 0x10)) {
        operator_delete(pp_Var14);
      }
      operator_delete((void *)sVar4);
    }
    if ((undefined1 *)CONCAT71(local_f8._1_7_,local_f8[0]) != local_f8 + 0x10) {
      operator_delete((undefined1 *)CONCAT71(local_f8._1_7_,local_f8[0]));
    }
    goto LAB_0010b54a;
  }
  testing::Message::Message((Message *)local_f8);
  if ((AutoCompactTest *)local_148._M_string_length == (AutoCompactTest *)0x0) {
    pp_Var14 = (_func_int **)0x15a8aa;
  }
  else {
    pp_Var14 = ((Test *)local_148._M_string_length)->_vptr_Test;
  }
  iVar15 = 0x49;
  goto LAB_0010b4f4;
}

Assistant:

void AutoCompactTest::DoReads(int n) {
  std::string value(kValueSize, 'x');
  DBImpl* dbi = reinterpret_cast<DBImpl*>(db_);

  // Fill database
  for (int i = 0; i < kCount; i++) {
    ASSERT_LEVELDB_OK(db_->Put(WriteOptions(), Key(i), value));
  }
  ASSERT_LEVELDB_OK(dbi->TEST_CompactMemTable());

  // Delete everything
  for (int i = 0; i < kCount; i++) {
    ASSERT_LEVELDB_OK(db_->Delete(WriteOptions(), Key(i)));
  }
  ASSERT_LEVELDB_OK(dbi->TEST_CompactMemTable());

  // Get initial measurement of the space we will be reading.
  const int64_t initial_size = Size(Key(0), Key(n));
  const int64_t initial_other_size = Size(Key(n), Key(kCount));

  // Read until size drops significantly.
  std::string limit_key = Key(n);
  for (int read = 0; true; read++) {
    ASSERT_LT(read, 100) << "Taking too long to compact";
    Iterator* iter = db_->NewIterator(ReadOptions());
    for (iter->SeekToFirst();
         iter->Valid() && iter->key().ToString() < limit_key; iter->Next()) {
      // Drop data
    }
    delete iter;
    // Wait a little bit to allow any triggered compactions to complete.
    Env::Default()->SleepForMicroseconds(1000000);
    uint64_t size = Size(Key(0), Key(n));
    std::fprintf(stderr, "iter %3d => %7.3f MB [other %7.3f MB]\n", read + 1,
                 size / 1048576.0, Size(Key(n), Key(kCount)) / 1048576.0);
    if (size <= initial_size / 10) {
      break;
    }
  }

  // Verify that the size of the key space not touched by the reads
  // is pretty much unchanged.
  const int64_t final_other_size = Size(Key(n), Key(kCount));
  ASSERT_LE(final_other_size, initial_other_size + 1048576);
  ASSERT_GE(final_other_size, initial_other_size / 5 - 1048576);
}